

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesStringWidget.cxx
# Opt level: O0

bool __thiscall cmCursesStringWidget::PrintKeys(cmCursesStringWidget *this)

{
  int local_238;
  int local_234;
  undefined1 local_228 [8];
  char firstLine [512];
  char fmt_s [3];
  int y;
  int x;
  cmCursesStringWidget *this_local;
  
  if (_stdscr == 0) {
    local_234 = -1;
    local_238 = -1;
  }
  else {
    local_234 = *(short *)(_stdscr + 4) + 1;
    local_238 = *(short *)(_stdscr + 6) + 1;
  }
  if ((local_238 < 0x41) || (local_234 < 6)) {
    this_local._7_1_ = false;
  }
  else if (((this->super_cmCursesWidget).field_0x3c & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    firstLine[0x1fd] = '%';
    firstLine[0x1fe] = 's';
    firstLine[0x1ff] = '\0';
    memset(local_228,0x20,0x200);
    firstLine[0x1f7] = '\0';
    curses_move(local_234 - 4,0);
    printw(firstLine + 0x1fd);
    curses_move(local_234 - 3,0);
    printw(firstLine + 0x1fd);
    curses_move(local_234 - 2,0);
    printw(firstLine + 0x1fd);
    curses_move(local_234 - 1,0);
    printw(firstLine + 0x1fd);
    curses_move(local_234 - 3,0);
    printw(firstLine + 0x1fd);
    curses_move(local_234 - 2,0);
    printw(firstLine + 0x1fd,"                press [esc] to cancel");
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCursesStringWidget::PrintKeys()
{
  int x, y;
  getmaxyx(stdscr, y, x);
  if (x < cmCursesMainForm::MIN_WIDTH || y < cmCursesMainForm::MIN_HEIGHT) {
    return false;
  }
  if (this->InEdit) {
    char fmt_s[] = "%s";
    char firstLine[512];
    // Clean the toolbar
    memset(firstLine, ' ', sizeof(firstLine));
    firstLine[511] = '\0';
    curses_move(y - 4, 0);
    printw(fmt_s, firstLine);
    curses_move(y - 3, 0);
    printw(fmt_s, firstLine);
    curses_move(y - 2, 0);
    printw(fmt_s, firstLine);
    curses_move(y - 1, 0);
    printw(fmt_s, firstLine);

    curses_move(y - 3, 0);
    printw(fmt_s, "Editing option, press [enter] to confirm");
    curses_move(y - 2, 0);
    printw(fmt_s, "                press [esc] to cancel");
    return true;
  }
  return false;
}